

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool cJSON_PrintPreallocated(cJSON *item,char *buffer,int length,cJSON_bool format)

{
  long lVar1;
  cJSON_bool cVar2;
  long in_FS_OFFSET;
  undefined1 auStack_58 [8];
  printbuffer p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  p.hooks.deallocate = (_func_void_void_ptr *)0x0;
  p.depth = 0;
  p.noalloc = 0;
  p.format = 0;
  p.length = 0;
  p.offset = 0;
  auStack_58 = (undefined1  [8])0x0;
  p.buffer = (uchar *)0x0;
  cVar2 = 0;
  if (buffer != (char *)0x0 && -1 < length) {
    p.buffer = (uchar *)(ulong)(uint)length;
    p.length = 0;
    p.depth = CONCAT44(format,1);
    p._32_8_ = global_hooks.allocate;
    p.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
    p.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
    auStack_58 = (undefined1  [8])buffer;
    cVar2 = print_value(item,(printbuffer *)auStack_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return cVar2;
  }
  __stack_chk_fail();
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_PrintPreallocated(cJSON *item, char *buffer, const int length, const cJSON_bool format)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if ((length < 0) || (buffer == NULL))
    {
        return false;
    }

    p.buffer = (unsigned char*)buffer;
    p.length = (size_t)length;
    p.offset = 0;
    p.noalloc = true;
    p.format = format;
    p.hooks = global_hooks;

    return print_value(item, &p);
}